

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

uint64_t __thiscall
RandomMixin<FastRandomContext>::randbits<32>(RandomMixin<FastRandomContext> *this)

{
  long lVar1;
  uint64_t uVar2;
  int iVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->bitbuf_size < 0x20) {
    uVar2 = FastRandomContext::rand64((FastRandomContext *)this);
    uVar4 = uVar2 << ((byte)this->bitbuf_size & 0x3f) | this->bitbuf;
    iVar3 = this->bitbuf_size + 0x20;
    this->bitbuf = uVar2 >> (-(char)iVar3 & 0x3fU);
  }
  else {
    uVar4 = this->bitbuf;
    this->bitbuf = uVar4 >> 0x20;
    iVar3 = this->bitbuf_size + -0x20;
  }
  this->bitbuf_size = iVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar4 & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t randbits() noexcept
    {
        static_assert(Bits >= 0 && Bits <= 64);
        if constexpr (Bits == 64) {
            return Impl().rand64();
        } else {
            uint64_t ret;
            if (Bits <= bitbuf_size) {
                ret = bitbuf;
                bitbuf >>= Bits;
                bitbuf_size -= Bits;
            } else {
                uint64_t gen = Impl().rand64();
                ret = (gen << bitbuf_size) | bitbuf;
                bitbuf = gen >> (Bits - bitbuf_size);
                bitbuf_size = 64 + bitbuf_size - Bits;
            }
            constexpr uint64_t MASK = (uint64_t{1} << Bits) - 1;
            return ret & MASK;
        }
    }